

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-million-timers.c
# Opt level: O2

int run_benchmark_million_timers(void)

{
  undefined1 auVar1 [16];
  int iVar2;
  void *__ptr;
  uv_loop_t *puVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  ulong timeout;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 uStackY_70;
  
  __ptr = malloc(1520000000);
  if (__ptr == (void *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-million-timers.c"
            ,0x34,"timers","!=","NULL",0,"!=",0);
    abort();
  }
  puVar3 = uv_default_loop();
  lVar10 = 0;
  uVar4 = uv_hrtime();
  uVar9 = 0;
  timeout = 0;
  do {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar9;
    if (lVar10 == 1520000000) {
      uVar5 = uv_hrtime();
      iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
      if (iVar2 == 0) {
        uVar6 = uv_hrtime();
        for (lVar10 = 0; lVar10 != 1520000000; lVar10 = lVar10 + 0x98) {
          uv_close((uv_handle_t *)((long)__ptr + lVar10),close_cb);
        }
        iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
        if (iVar2 == 0) {
          uVar7 = uv_hrtime();
          if (timer_cb_called == 10000000) {
            if (close_cb_called == 10000000) {
              free(__ptr);
              lVar10 = uVar7 - uVar4;
              auVar11._8_4_ = (int)((ulong)lVar10 >> 0x20);
              auVar11._0_8_ = lVar10;
              auVar11._12_4_ = 0x45300000;
              fprintf(_stderr,"%.2f seconds total\n",
                      ((auVar11._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) /
                      1000000000.0);
              lVar10 = uVar5 - uVar4;
              auVar12._8_4_ = (int)((ulong)lVar10 >> 0x20);
              auVar12._0_8_ = lVar10;
              auVar12._12_4_ = 0x45300000;
              fprintf(_stderr,"%.2f seconds init\n",
                      ((auVar12._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) /
                      1000000000.0);
              lVar10 = uVar6 - uVar5;
              auVar13._8_4_ = (int)((ulong)lVar10 >> 0x20);
              auVar13._0_8_ = lVar10;
              auVar13._12_4_ = 0x45300000;
              fprintf(_stderr,"%.2f seconds dispatch\n",
                      ((auVar13._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) /
                      1000000000.0);
              lVar10 = uVar7 - uVar6;
              auVar14._8_4_ = (int)((ulong)lVar10 >> 0x20);
              auVar14._0_8_ = lVar10;
              auVar14._12_4_ = 0x45300000;
              fprintf(_stderr,"%.2f seconds cleanup\n",
                      ((auVar14._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0)) /
                      1000000000.0);
              fflush(_stderr);
              puVar3 = uv_default_loop();
              uv_walk(puVar3,close_walk_cb,(void *)0x0);
              uv_run(puVar3,UV_RUN_DEFAULT);
              puVar3 = uv_default_loop();
              iVar2 = uv_loop_close(puVar3);
              if (iVar2 == 0) {
                uv_library_shutdown();
                return 0;
              }
              pcVar8 = "0 == uv_loop_close(uv_default_loop())";
              uStackY_70 = 0x54;
            }
            else {
              pcVar8 = "close_cb_called == NUM_TIMERS";
              uStackY_70 = 0x4b;
            }
          }
          else {
            pcVar8 = "timer_cb_called == NUM_TIMERS";
            uStackY_70 = 0x4a;
          }
        }
        else {
          pcVar8 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
          uStackY_70 = 0x47;
        }
      }
      else {
        pcVar8 = "0 == uv_run(loop, UV_RUN_DEFAULT)";
        uStackY_70 = 0x41;
      }
      goto LAB_00107e97;
    }
    iVar2 = uv_timer_init(puVar3,(uv_timer_t *)((long)__ptr + lVar10));
    if (iVar2 != 0) {
      pcVar8 = "0 == uv_timer_init(loop, timers + i)";
      uStackY_70 = 0x3c;
      goto LAB_00107e97;
    }
    timeout = (ulong)((int)timeout +
                     (uint)(SUB164(auVar1 / ZEXT816(1000),0) * 0x251c0 == (int)lVar10));
    iVar2 = uv_timer_start((uv_timer_t *)((long)__ptr + lVar10),timer_cb,timeout,0);
    uVar9 = uVar9 + 1;
    lVar10 = lVar10 + 0x98;
  } while (iVar2 == 0);
  pcVar8 = "0 == uv_timer_start(timers + i, timer_cb, timeout, 0)";
  uStackY_70 = 0x3d;
LAB_00107e97:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-million-timers.c"
          ,uStackY_70,pcVar8);
  abort();
}

Assistant:

BENCHMARK_IMPL(million_timers) {
  uv_timer_t* timers;
  uv_loop_t* loop;
  uint64_t before_all;
  uint64_t before_run;
  uint64_t after_run;
  uint64_t after_all;
  int timeout;
  int i;

  timers = malloc(NUM_TIMERS * sizeof(timers[0]));
  ASSERT_NOT_NULL(timers);

  loop = uv_default_loop();
  timeout = 0;

  before_all = uv_hrtime();
  for (i = 0; i < NUM_TIMERS; i++) {
    if (i % 1000 == 0) timeout++;
    ASSERT(0 == uv_timer_init(loop, timers + i));
    ASSERT(0 == uv_timer_start(timers + i, timer_cb, timeout, 0));
  }

  before_run = uv_hrtime();
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  after_run = uv_hrtime();

  for (i = 0; i < NUM_TIMERS; i++)
    uv_close((uv_handle_t*) (timers + i), close_cb);

  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  after_all = uv_hrtime();

  ASSERT(timer_cb_called == NUM_TIMERS);
  ASSERT(close_cb_called == NUM_TIMERS);
  free(timers);

  fprintf(stderr, "%.2f seconds total\n", (after_all - before_all) / 1e9);
  fprintf(stderr, "%.2f seconds init\n", (before_run - before_all) / 1e9);
  fprintf(stderr, "%.2f seconds dispatch\n", (after_run - before_run) / 1e9);
  fprintf(stderr, "%.2f seconds cleanup\n", (after_all - after_run) / 1e9);
  fflush(stderr);

  MAKE_VALGRIND_HAPPY();
  return 0;
}